

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlXPathObjectPtr xmlXPathVariableLookup(xmlXPathContextPtr ctxt,xmlChar *name)

{
  xmlXPathObjectPtr pxVar1;
  
  if (ctxt == (xmlXPathContextPtr)0x0) {
    return (xmlXPathObjectPtr)0x0;
  }
  if (ctxt->varLookupFunc != (xmlXPathVariableLookupFunc)0x0) {
    pxVar1 = (*ctxt->varLookupFunc)(ctxt->varLookupData,name,(xmlChar *)0x0);
    return pxVar1;
  }
  pxVar1 = xmlXPathVariableLookupNS(ctxt,name,(xmlChar *)0x0);
  return pxVar1;
}

Assistant:

xmlXPathObjectPtr
xmlXPathVariableLookup(xmlXPathContextPtr ctxt, const xmlChar *name) {
    if (ctxt == NULL)
	return(NULL);

    if (ctxt->varLookupFunc != NULL) {
	xmlXPathObjectPtr ret;

	ret = ((xmlXPathVariableLookupFunc)ctxt->varLookupFunc)
	        (ctxt->varLookupData, name, NULL);
	return(ret);
    }
    return(xmlXPathVariableLookupNS(ctxt, name, NULL));
}